

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution_monitor.hpp
# Opt level: O1

void __thiscall
boost::execution_exception::execution_exception
          (execution_exception *this,execution_exception *param_2)

{
  iterator pvVar1;
  
  this->m_error_code = param_2->m_error_code;
  pvVar1 = (param_2->m_what).m_end;
  (this->m_what).m_begin = (param_2->m_what).m_begin;
  (this->m_what).m_end = pvVar1;
  pvVar1 = (param_2->m_location).m_file_name.m_end;
  (this->m_location).m_file_name.m_begin = (param_2->m_location).m_file_name.m_begin;
  (this->m_location).m_file_name.m_end = pvVar1;
  (this->m_location).m_line_num = (param_2->m_location).m_line_num;
  pvVar1 = (param_2->m_location).m_function.m_end;
  (this->m_location).m_function.m_begin = (param_2->m_location).m_function.m_begin;
  (this->m_location).m_function.m_end = pvVar1;
  return;
}

Assistant:

class BOOST_TEST_DECL execution_exception {
    typedef boost::unit_test::const_string const_string;
public:
    /// These values are sometimes used as program return codes.
    /// The particular values have been chosen to avoid conflicts with
    /// commonly used program return codes: values < 100 are often user
    /// assigned, values > 255 are sometimes used to report system errors.
    /// Gaps in values allow for orderly expansion.
    ///
    /// @note(1) Only uncaught C++ exceptions are treated as errors.
    /// If a function catches a C++ exception, it never reaches
    /// the execution_monitor.
    ///
    /// The implementation decides what is a system_fatal_error and what is
    /// just a system_exception. Fatal errors are so likely to have corrupted
    /// machine state (like a stack overflow or addressing exception) that it
    /// is unreasonable to continue execution.
    ///
    /// @note(2) These errors include Unix signals and Windows structured
    /// exceptions. They are often initiated by hardware traps.
    enum error_code {
        no_error               = 0,   ///< for completeness only; never returned
        user_error             = 200, ///< user reported non-fatal error
        cpp_exception_error    = 205, ///< see note (1) above
        system_error           = 210, ///< see note (2) above
        timeout_error          = 215, ///< only detectable on certain platforms
        user_fatal_error       = 220, ///< user reported fatal error
        system_fatal_error     = 225  ///< see note (2) above
    };

    /// Simple model for the location of failure in a source code
    struct BOOST_TEST_DECL location {
        explicit    location( char const* file_name = 0, size_t line_num = 0, char const* func = 0 );
        explicit    location( const_string file_name, size_t line_num = 0, char const* func = 0 );

        const_string    m_file_name;    ///< File name
        size_t          m_line_num;     ///< Line number
        const_string    m_function;     ///< Function name
    };

    /// @name Constructors

    /// Constructs instance based on message, location and error code

    /// @param[in] ec           error code
    /// @param[in] what_msg     error message
    /// @param[in] location     error location
    execution_exception( error_code ec, const_string what_msg, location const& location );

    /// @name Access methods

    /// Exception error code
    error_code      code() const    { return m_error_code; }
    /// Exception message
    const_string    what() const    { return m_what; }
    /// Exception location
    location const& where() const   { return m_location; }
    ///@}

private:
    // Data members
    error_code      m_error_code;
    const_string    m_what;
    location        m_location;
}